

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_bind_null(sqlite3_stmt *stmt,int idx)

{
  int iVar1;
  LogicalType local_70;
  Value local_58;
  
  duckdb::LogicalType::LogicalType(&local_70,SQLNULL);
  duckdb::Value::Value(&local_58,&local_70);
  iVar1 = sqlite3_internal_bind_value(stmt,idx,&local_58);
  duckdb::Value::~Value(&local_58);
  duckdb::LogicalType::~LogicalType(&local_70);
  return iVar1;
}

Assistant:

int sqlite3_bind_null(sqlite3_stmt *stmt, int idx) {
	return sqlite3_internal_bind_value(stmt, idx, Value());
}